

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

optional<tinyusdz::Animatable<double>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<double>
          (optional<tinyusdz::Animatable<double>_> *__return_storage_ptr__,PrimVar *var)

{
  TimeSamples *this;
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  optional<tinyusdz::Animatable<double>_> *poVar4;
  ulong uVar5;
  optional<tinyusdz::Animatable<double>_> *extraout_RAX;
  undefined8 uVar6;
  long lVar7;
  pointer pSVar8;
  ulong uVar9;
  optional<double> pv;
  optional<double> local_80;
  storage_t<double> local_70;
  undefined2 local_68;
  TypedTimeSamples<double> local_60;
  optional<double> local_40;
  
  local_70 = (storage_t<double>)0x0;
  local_68 = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_60._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_60._dirty = false;
  bVar2 = primvar::PrimVar::is_valid(var);
  poVar4 = (optional<tinyusdz::Animatable<double>_> *)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    if ((var->_blocked == false) && (pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)
       ) {
      uVar3 = (*pvVar1->type_id)();
      poVar4 = (optional<tinyusdz::Animatable<double>_> *)CONCAT44(extraout_var_00,uVar3);
      if (uVar3 != 0) {
        pvVar1 = (var->_value).v_.vtable;
        if (pvVar1 != (vtable_type *)0x0) {
          uVar3 = (*pvVar1->type_id)();
          poVar4 = (optional<tinyusdz::Animatable<double>_> *)CONCAT44(extraout_var_01,uVar3);
          if (uVar3 == 1) goto LAB_0024487d;
        }
        goto LAB_0024483e;
      }
LAB_0024487d:
      pSVar8 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish == pSVar8) goto LAB_0024496c;
LAB_0024488b:
      this = &var->_ts;
      lVar7 = 0;
      uVar9 = 0;
      do {
        if ((var->_ts)._dirty == true) {
          tinyusdz::value::TimeSamples::update(this);
          pSVar8 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((&pSVar8->blocked)[lVar7] == true) {
          TypedTimeSamples<double>::add_blocked_sample
                    (&local_60,*(double *)((long)&pSVar8->t + lVar7));
        }
        else {
          tinyusdz::value::Value::get_value<double>
                    (&local_40,(Value *)((long)&(pSVar8->value).v_.storage + lVar7),false);
          local_80.has_value_ = local_40.has_value_;
          if (local_40.has_value_ != true) {
            __return_storage_ptr__->has_value_ = false;
            *(undefined8 *)&__return_storage_ptr__->contained = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
            if (local_60._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              return __return_storage_ptr__;
            }
            operator_delete(local_60._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT71(local_60._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                     local_60._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                            (long)local_60._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            return extraout_RAX;
          }
          local_80.contained = local_40.contained;
          TypedTimeSamples<double>::add_sample
                    (&local_60,*(double *)((long)&pSVar8->t + lVar7),(double *)&local_80.contained);
        }
        uVar9 = uVar9 + 1;
        pSVar8 = (this->_samples).
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(var->_ts)._samples.
                       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 3) *
                -0x3333333333333333;
        lVar7 = lVar7 + 0x28;
      } while (uVar9 < uVar5);
      uVar6 = CONCAT71(local_60._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                       local_60._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
      poVar4 = (optional<tinyusdz::Animatable<double>_> *)
               CONCAT71((int7)(uVar5 >> 8),local_60._dirty);
    }
    else {
LAB_0024483e:
      poVar4 = (optional<tinyusdz::Animatable<double>_> *)
               primvar::PrimVar::get_value<double>(&local_80,var);
      if (local_80.has_value_ == false) goto LAB_0024487d;
      local_70 = local_80.contained;
      local_68 = 1;
      pSVar8 = (var->_ts)._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar8) goto LAB_0024488b;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_60._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      poVar4 = (optional<tinyusdz::Animatable<double>_> *)0x0;
      uVar6 = 0;
    }
    __return_storage_ptr__->has_value_ = true;
    *(storage_t<double> *)&__return_storage_ptr__->contained = local_70;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 8) = local_68;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x10) =
         local_60._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x14) =
         local_60._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x18) =
         local_60._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x1c) =
         local_60._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<double>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = uVar6;
    *(char *)((long)&__return_storage_ptr__->contained + 0x28) = (char)poVar4;
  }
  else {
LAB_0024496c:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
  return poVar4;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}